

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O3

void __thiscall
MeshDenoisingBase::getAllFaceNeighbor
          (MeshDenoisingBase *this,TriMesh *mesh,
          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          *all_face_neighbor,FaceNeighborType face_neighbor_type,bool include_central_face)

{
  mesh_ptr pPVar1;
  size_type __new_size;
  ulong uVar2;
  MeshDenoisingBase *this_00;
  FaceIter FVar3;
  FaceIter FVar4;
  void *pvStack_68;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  undefined1 local_40 [8];
  FaceIter f_it;
  
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))(mesh);
  std::
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  ::resize(all_face_neighbor,__new_size);
  FVar3 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  uVar2 = FVar3._8_8_;
  this_00 = (MeshDenoisingBase *)mesh;
  _local_40 = FVar3;
  FVar4 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
  if (FVar3.hnd_.super_BaseHandle.idx_.super_BaseHandle !=
      (BaseHandle)FVar4.hnd_.super_BaseHandle.idx_ || FVar3.mesh_ != FVar4.mesh_) {
    do {
      pvStack_68 = (void *)0x0;
      face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      getFaceNeighbor(this_00,mesh,(BaseHandle)(int)uVar2,face_neighbor_type,
                      (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                      &pvStack_68);
      if (include_central_face) {
        if (face_neighbor.
            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
            super__Vector_impl_data._M_start ==
            face_neighbor.
            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
          _M_realloc_insert<OpenMesh::FaceHandle_const&>
                    ((vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)
                     &pvStack_68,
                     (iterator)
                     face_neighbor.
                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start,(FaceHandle *)&f_it);
        }
        else {
          ((face_neighbor.
            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
            super__Vector_impl_data._M_start)->super_BaseHandle).idx_ = (int)f_it.mesh_._0_4_;
          face_neighbor.
          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Vector_impl_data._M_start =
               face_neighbor.
               super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::operator=
                ((all_face_neighbor->
                 super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + (int)f_it.mesh_._0_4_,
                 (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&pvStack_68)
      ;
      if (pvStack_68 != (void *)0x0) {
        operator_delete(pvStack_68);
      }
      pPVar1 = f_it.mesh_;
      f_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)local_40._8_4_.super_BaseHandle + 1);
      if ((ulong)pPVar1 >> 0x20 != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_40);
      }
      this_00 = (MeshDenoisingBase *)mesh;
      FVar3 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
      uVar2 = (ulong)(uint)f_it.mesh_._0_4_;
    } while (f_it.mesh_._0_4_ != (BaseHandle)FVar3.hnd_.super_BaseHandle.idx_ ||
             local_40 != (undefined1  [8])FVar3.mesh_);
  }
  return;
}

Assistant:

void MeshDenoisingBase::getAllFaceNeighbor(TriMesh &mesh, std::vector<std::vector<TriMesh::FaceHandle> > &all_face_neighbor, FaceNeighborType face_neighbor_type, bool include_central_face)
{
    all_face_neighbor.resize(mesh.n_faces());
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        std::vector<TriMesh::FaceHandle> face_neighbor;
        getFaceNeighbor(mesh, *f_it, face_neighbor_type, face_neighbor);
        if(include_central_face) face_neighbor.push_back(*f_it);
        all_face_neighbor[f_it->idx()] = face_neighbor;
    }
}